

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eeep_parse.c
# Opt level: O0

void ParseExpressCard(ExpCardBlock_t *dblock,int size)

{
  byte bVar1;
  int local_1c;
  uint8_t dev_func;
  int i;
  int addr_array_size;
  int size_local;
  ExpCardBlock_t *dblock_local;
  
  printf("   Express Card block:\n      Card: %d, USB Port: %d, PCIExpress Port: %d\n",
         (ulong)dblock->ExpressCardNumber,(ulong)(uint)((int)(uint)dblock->ComExpressPort >> 5),
         (ulong)(dblock->ComExpressPort & 0x1f));
  printf("      Switch Addresses: ");
  for (local_1c = 0;
      (local_1c < size + -5 && (bVar1 = dblock->SwitchDevFuncAddr[local_1c], bVar1 != 0xff));
      local_1c = local_1c + 1) {
    if (local_1c != 0) {
      printf(", ");
    }
    printf("%d:%d",(ulong)(uint)((int)(uint)bVar1 >> 3),(ulong)(bVar1 & 7));
  }
  printf("\n");
  return;
}

Assistant:

void ParseExpressCard(ExpCardBlock_t *dblock, int size)
{
	int addr_array_size = size - FIELD_OFFSET(ExpCardBlock_t, SwitchDevFuncAddr);
	printf("   Express Card block:\n      Card: %d, USB Port: %d, PCIExpress Port: %d\n", 
		dblock->ExpressCardNumber, dblock->ComExpressPort >> 5, dblock->ComExpressPort & 0x1F);
	printf("      Switch Addresses: ");
	for( int i = 0; i < addr_array_size; i++ ) {
		uint8_t dev_func = dblock->SwitchDevFuncAddr[i];
		if(dev_func == 0xFF)
			break;
		if(i != 0) {
			printf(", ");
		}
		printf("%d:%d", dev_func >> 3, dev_func & 7);
	}
	printf("\n");
}